

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.cpp
# Opt level: O1

void llvm::report_bad_alloc_error(char *Reason,bool GenCrashDiag)

{
  fatal_error_handler_t p_Var1;
  void *pvVar2;
  int iVar3;
  allocator local_49;
  string local_48;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&BadAllocErrorHandlerMutex);
  pvVar2 = BadAllocErrorHandlerUserData;
  p_Var1 = BadAllocErrorHandler_abi_cxx11_;
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&BadAllocErrorHandlerMutex);
  if (p_Var1 == (fatal_error_handler_t)0x0) {
    write(2,"LLVM ERROR: out of memory\n",0x1a);
    abort();
  }
  std::__cxx11::string::string((string *)&local_48,Reason,&local_49);
  (*p_Var1)(pvVar2,&local_48,GenCrashDiag);
  std::__cxx11::string::~string((string *)&local_48);
  llvm_unreachable_internal
            ("bad alloc handler should not return",
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ErrorHandling.cpp"
             ,0xa2);
}

Assistant:

void llvm::report_bad_alloc_error(const char *Reason, bool GenCrashDiag) {
  fatal_error_handler_t Handler = nullptr;
  void *HandlerData = nullptr;
  {
    // Only acquire the mutex while reading the handler, so as not to invoke a
    // user-supplied callback under a lock.
#if LLVM_ENABLE_THREADS == 1
    std::lock_guard<std::mutex> Lock(BadAllocErrorHandlerMutex);
#endif
    Handler = BadAllocErrorHandler;
    HandlerData = BadAllocErrorHandlerUserData;
  }

  if (Handler) {
    Handler(HandlerData, Reason, GenCrashDiag);
    llvm_unreachable("bad alloc handler should not return");
  }

#ifdef LLVM_ENABLE_EXCEPTIONS
  // If exceptions are enabled, make OOM in malloc look like OOM in new.
  throw std::bad_alloc();
#else
  // Don't call the normal error handler. It may allocate memory. Directly write
  // an OOM to stderr and abort.
  char OOMMessage[] = "LLVM ERROR: out of memory\n";
  ssize_t written = ::write(2, OOMMessage, strlen(OOMMessage));
  (void)written;
  abort();
#endif
}